

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

uint32_t get_number(char *prompt,uint32_t lbound,uint32_t ubound)

{
  int iVar1;
  char *pcVar2;
  uint32_t n;
  char str [64];
  uint local_7c;
  char local_78 [72];
  
  printf("%s",prompt);
  pcVar2 = fgets(local_78,0x40,_stdin);
  if (pcVar2 != (char *)0x0) {
    do {
      if ((local_78[0] == '\n') || (iVar1 = __isoc99_sscanf(local_78,"%u",&local_7c), iVar1 == 0)) {
        puts("Invalid number!");
      }
      else {
        if (lbound <= local_7c && local_7c <= ubound) {
          return local_7c;
        }
        printf("The number should be within %d and %d!\n",lbound,(ulong)ubound);
      }
      printf("%s",prompt);
      pcVar2 = fgets(local_78,0x40,_stdin);
    } while (pcVar2 != (char *)0x0);
  }
  putchar(10);
  return 0xffffffff;
}

Assistant:

uint32_t get_number(const char* prompt, const uint32_t lbound, const uint32_t ubound) {
  uint32_t n;
  char str[64];
  while (true) {
    printf("%s", prompt);

    if (fgets(str, sizeof str, stdin) == NULL) {
      printf("\n");
      return UINT32_MAX;
    }

    if (*str != '\n' && sscanf(str, "%" SCNu32, &n)) {
      if (n < lbound || n > ubound) {
        printf("The number should be within %d and %d!\n", lbound, ubound);
      } else return n;
    } else {
      printf("Invalid number!\n");
    }
  }
}